

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O2

bool __thiscall Uic::isContainer(Uic *this,QString *className)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  long in_FS_OFFSET;
  initializer_list<QString> args;
  QArrayDataPointer<char16_t> QStack_d8;
  QString local_c0;
  QString local_a8;
  QString local_90;
  QString local_78;
  QString local_60;
  QString local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (isContainer(QString_const&)::containers == '\0') {
    iVar2 = __cxa_guard_acquire(&isContainer(QString_const&)::containers);
    if (iVar2 != 0) {
      Qt::Literals::StringLiterals::operator____s((QString *)&QStack_d8,L"QStackedWidget",0xe);
      Qt::Literals::StringLiterals::operator____s(&local_c0,L"QToolBox",8);
      Qt::Literals::StringLiterals::operator____s(&local_a8,L"QTabWidget",10);
      Qt::Literals::StringLiterals::operator____s(&local_90,L"QScrollArea",0xb);
      Qt::Literals::StringLiterals::operator____s(&local_78,L"QMdiArea",8);
      Qt::Literals::StringLiterals::operator____s(&local_60,L"QWizard",7);
      Qt::Literals::StringLiterals::operator____s(&local_48,L"QDockWidget",0xb);
      args._M_len = 7;
      args._M_array = (iterator)&QStack_d8;
      QList<QString>::QList(&isContainer::containers,args);
      lVar3 = 0x90;
      do {
        QArrayDataPointer<char16_t>::~QArrayDataPointer
                  ((QArrayDataPointer<char16_t> *)((long)&QStack_d8.d + lVar3));
        lVar3 = lVar3 + -0x18;
      } while (lVar3 != -0x18);
      __cxa_atexit(QList<QString>::~QList,&isContainer::containers,&__dso_handle);
      __cxa_guard_release(&isContainer(QString_const&)::containers);
    }
  }
  bVar1 = CustomWidgetsInfo::extendsOneOf(&this->cWidgetsInfo,className,&isContainer::containers);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar1;
  }
  __stack_chk_fail();
}

Assistant:

bool Uic::isContainer(const QString &className) const
{
    static const QStringList containers = {
        u"QStackedWidget"_s, u"QToolBox"_s,
        u"QTabWidget"_s, u"QScrollArea"_s,
        u"QMdiArea"_s, u"QWizard"_s,
        u"QDockWidget"_s
    };

    return customWidgetsInfo()->extendsOneOf(className, containers);
}